

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.cpp
# Opt level: O2

void moveBits(uint8_t *buffer,int oldBitOffset,int newBitOffset,int len)

{
  uint value;
  uint uVar1;
  uint *buffer_00;
  uint *buffer_01;
  BitStreamWriter writer;
  BitStreamReader reader;
  
  buffer_00 = (uint *)(buffer + (oldBitOffset >> 3));
  reader.super_BitStream.m_totalBits = 0;
  reader.m_curVal = 0;
  reader.m_bitLeft = 0;
  reader.super_BitStream.m_buffer = (uint *)0x0;
  reader.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamReader::setBuffer
            (&reader,(uint8_t *)buffer_00,(byte *)((long)buffer_00 + (long)(len / 8) + 1));
  writer.super_BitStream.m_totalBits = 0;
  writer.super_BitStream.m_buffer = (uint *)0x0;
  writer.super_BitStream.m_initBuffer = (uint *)0x0;
  writer.m_curVal = 0;
  writer.m_bitWrited = 0;
  BitStreamWriter::setBuffer
            (&writer,buffer + (newBitOffset >> 3),buffer + (newBitOffset >> 3) + (long)(len / 8) + 1
            );
  BitStreamWriter::skipBits(&writer,newBitOffset % 8);
  uVar1 = oldBitOffset % 8;
  if (uVar1 != 0) {
    BitStreamReader::skipBits(&reader,uVar1);
    uVar1 = 8 - uVar1;
    value = BitStreamReader::getBits(&reader,uVar1);
    BitStreamWriter::putBits(&writer,uVar1,value);
    len = len - uVar1;
    buffer_00 = (uint *)((long)buffer_00 + 1);
  }
  buffer_01 = buffer_00;
  for (; (7 < len && (((ulong)buffer_00 & 3) != 0)); buffer_00 = (uint *)((long)buffer_00 + 1)) {
    BitStreamWriter::putBits(&writer,8,(uint)(byte)*buffer_01);
    buffer_01 = (uint *)((long)buffer_01 + 1);
    len = len - 8;
  }
  for (; 0x1f < len; len = len - 0x20) {
    BitStreamWriter::putBits(&writer,0x20,*buffer_01);
    buffer_01 = buffer_01 + 1;
  }
  BitStreamReader::setBuffer(&reader,(uint8_t *)buffer_01,(uint8_t *)(buffer_01 + 1));
  uVar1 = BitStreamReader::getBits(&reader,len);
  BitStreamWriter::putBits(&writer,len,uVar1);
  BitStreamWriter::flushBits(&writer);
  return;
}

Assistant:

void moveBits(uint8_t* buffer, const int oldBitOffset, const int newBitOffset, int len)
{
    uint8_t* src = buffer + (oldBitOffset >> 3);
    BitStreamReader reader{};
    reader.setBuffer(src, src + len / 8 + 1);
    uint8_t* dst = buffer + (newBitOffset >> 3);
    BitStreamWriter writer{};
    writer.setBuffer(dst, dst + len / 8 + 1);
    writer.skipBits(newBitOffset % 8);
    if (oldBitOffset % 8)
    {
        reader.skipBits(oldBitOffset % 8);
        const int c = 8 - (oldBitOffset % 8);
        writer.putBits(c, reader.getBits(c));
        len -= c;
        src++;
    }
    for (; len >= 8 && (reinterpret_cast<std::uintptr_t>(src) % sizeof(unsigned)) != 0; len -= 8)
    {
        writer.putBits(8, *src);
        src++;
    }

    for (; len >= static_cast<int>(INT_BIT); len -= INT_BIT)
    {
        writer.putBits(INT_BIT, *reinterpret_cast<unsigned*>(src));
        src += sizeof(unsigned);
    }
    reader.setBuffer(src, src + sizeof(unsigned));
    writer.putBits(len, reader.getBits(len));
    writer.flushBits();
}